

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int __thiscall cmVSLink::LinkIncremental(cmVSLink *this)

{
  string *in_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  allocator<char> local_269;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcCommand;
  string absManifestFile;
  ofstream fout;
  
  in_path = &this->ManifestFile;
  cmsys::SystemTools::CollapseFullPath(&absManifestFile,in_path);
  if (this->Verbose == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Create ");
    poVar3 = std::operator<<(poVar3,(string *)&this->ManifestFileRC);
    std::operator<<(poVar3,"\n");
  }
  std::ofstream::ofstream(&fout,(this->ManifestFileRC)._M_dataplus._M_p,_S_out);
  if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
      == 0) {
    std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                    "#pragma code_page(65001)\n");
    poVar3 = (ostream *)std::ostream::operator<<(&fout,this->Type);
    poVar3 = std::operator<<(poVar3,
                             " /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ 24 /* RT_MANIFEST */ \"");
    poVar3 = std::operator<<(poVar3,(string *)&absManifestFile);
    std::operator<<(poVar3,"\"");
    std::ofstream::~ofstream(&fout);
    bVar1 = cmsys::SystemTools::FileExists(in_path);
    if (!bVar1) {
      if (this->Verbose == true) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Create empty: ");
        poVar3 = std::operator<<(poVar3,(string *)in_path);
        std::operator<<(poVar3,"\n");
      }
      if ((this->UserManifests).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->UserManifests).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::ofstream::ofstream(&fout,(in_path->_M_dataplus)._M_p,_S_out);
        std::ofstream::~ofstream(&fout);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                       "/out:",in_path);
        RunMT(this,(string *)&fout,false);
        std::__cxx11::string::~string((string *)&fout);
      }
    }
    rcCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rcCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rcCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((this->RcPath)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&fout,"rc",&local_269);
    }
    else {
      std::__cxx11::string::string((string *)&fout,(string *)&this->RcPath);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rcCommand,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rcCommand,
               (char (*) [4])"/fo");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&rcCommand,&this->ManifestFileRes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&rcCommand,&this->ManifestFileRC);
    bVar1 = RunCommand("RC Pass 1",&rcCommand,this->Verbose,FORMAT_DECIMAL,(int *)0x0,
                       (_func_bool_int *)0x0);
    iVar4 = -1;
    iVar2 = iVar4;
    if (bVar1) {
      this_00 = &this->LinkCommand;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&this->ManifestFileRes);
      bVar1 = RunCommand("LINK Pass 1",this_00,this->Verbose,FORMAT_DECIMAL,(int *)0x0,
                         (_func_bool_int *)0x0);
      if (bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                       "/out:",in_path);
        iVar2 = RunMT(this,(string *)&fout,true);
        std::__cxx11::string::~string((string *)&fout);
        if (((iVar2 == 0xbb) || (iVar2 == 0x41020001)) &&
           (bVar1 = RunCommand("RC Pass 2",&rcCommand,this->Verbose,FORMAT_DECIMAL,(int *)0x0,
                               (_func_bool_int *)0x0), iVar2 = iVar4, bVar1)) {
          bVar1 = RunCommand("FINAL LINK",this_00,this->Verbose,FORMAT_DECIMAL,(int *)0x0,
                             (_func_bool_int *)0x0);
          iVar2 = bVar1 - 1;
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&rcCommand);
  }
  else {
    std::ofstream::~ofstream(&fout);
    iVar2 = -1;
  }
  std::__cxx11::string::~string((string *)&absManifestFile);
  return iVar2;
}

Assistant:

int cmVSLink::LinkIncremental()
{
  // This follows the steps listed here:
  // http://blogs.msdn.com/zakramer/archive/2006/05/22/603558.aspx

  //    1.  Compiler compiles the application and generates the *.obj files.
  //    2.  An empty manifest file is generated if this is a clean build and
  //    if not the previous one is reused.
  //    3.  The resource compiler (rc.exe) compiles the *.manifest file to a
  //    *.res file.
  //    4.  Linker generates the binary (EXE or DLL) with the /incremental
  //    switch and embeds the dummy manifest file. The linker also generates
  //    the real manifest file based on the binaries that your binary depends
  //    on.
  //    5.  The manifest tool (mt.exe) is then used to generate the final
  //    manifest.

  // If the final manifest is changed, then 6 and 7 are run, if not
  // they are skipped, and it is done.

  //    6.  The resource compiler is invoked one more time.
  //    7.  Finally, the Linker does another incremental link, but since the
  //    only thing that has changed is the *.res file that contains the
  //    manifest it is a short link.

  // Create a resource file referencing the manifest.
  std::string absManifestFile =
    cmSystemTools::CollapseFullPath(this->ManifestFile);
  if (this->Verbose) {
    std::cout << "Create " << this->ManifestFileRC << "\n";
  }
  {
    cmsys::ofstream fout(this->ManifestFileRC.c_str());
    if (!fout) {
      return -1;
    }
    // Insert a pragma statement to specify utf-8 encoding.
    fout << "#pragma code_page(65001)\n";
    fout << this->Type
         << " /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ "
            "24 /* RT_MANIFEST */ \""
         << absManifestFile << "\"";
  }

  // If we have not previously generated a manifest file,
  // generate a manifest file so the resource compiler succeeds.
  if (!cmSystemTools::FileExists(this->ManifestFile)) {
    if (this->Verbose) {
      std::cout << "Create empty: " << this->ManifestFile << "\n";
    }
    if (this->UserManifests.empty()) {
      // generate an empty manifest because there are no user provided
      // manifest files.
      cmsys::ofstream foutTmp(this->ManifestFile.c_str());
    } else {
      this->RunMT("/out:" + this->ManifestFile, false);
    }
  }

  // Compile the resource file.
  std::vector<std::string> rcCommand;
  rcCommand.push_back(this->RcPath.empty() ? "rc" : this->RcPath);
  rcCommand.emplace_back("/fo");
  rcCommand.push_back(this->ManifestFileRes);
  rcCommand.push_back(this->ManifestFileRC);
  if (!RunCommand("RC Pass 1", rcCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // Tell the linker to use our manifest compiled into a resource.
  this->LinkCommand.push_back(this->ManifestFileRes);

  // Run the link command (possibly generates intermediate manifest).
  if (!RunCommand("LINK Pass 1", this->LinkCommand, this->Verbose,
                  FORMAT_DECIMAL)) {
    return -1;
  }

  // Run the manifest tool to create the final manifest.
  int mtRet = this->RunMT("/out:" + this->ManifestFile, true);

  // If mt returns a special value then it updated the manifest file so
  // we need to embed it again.  Otherwise we are done.
  if (!mtRetIsUpdate(mtRet)) {
    return mtRet;
  }

  // Compile the resource file again.
  if (!RunCommand("RC Pass 2", rcCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // Link incrementally again to use the updated resource.
  if (!RunCommand("FINAL LINK", this->LinkCommand, this->Verbose,
                  FORMAT_DECIMAL)) {
    return -1;
  }
  return 0;
}